

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

void fmt_PrintString(char *buf,size_t bufLen,FormatSpec *fmt,char *value)

{
  ulong uVar1;
  size_t i_1;
  size_t __n;
  long lVar2;
  ulong uVar3;
  size_t i;
  
  if (fmt->sign != 0) {
    error("Formatting string with sign flag \'%c\'\n");
  }
  if (fmt->prefix == true) {
    error("Formatting string with prefix flag \'#\'\n");
  }
  if (fmt->padZero == true) {
    error("Formatting string with padding flag \'0\'\n");
  }
  if (fmt->hasFrac == true) {
    error("Formatting string with fractional width\n");
  }
  if (fmt->type != 0x73) {
    error("Formatting string as type \'%c\'\n");
  }
  __n = strlen(value);
  uVar3 = fmt->width;
  if (fmt->width <= __n) {
    uVar3 = __n;
  }
  uVar1 = bufLen - 1;
  if ((uVar1 < uVar3) && (error("Formatted string value too long\n"), uVar3 = uVar1, uVar1 <= __n))
  {
    __n = uVar1;
  }
  if (((__n <= uVar3) && (uVar3 < bufLen)) && (__n < bufLen)) {
    if (fmt->alignLeft == false) {
      for (lVar2 = 0; uVar3 - __n != lVar2; lVar2 = lVar2 + 1) {
        buf[lVar2] = ' ';
      }
      memcpy(buf + (uVar3 - __n),value,__n);
    }
    else {
      memcpy(buf,value,__n);
      for (; uVar3 != __n; __n = __n + 1) {
        buf[__n] = ' ';
      }
    }
    buf[uVar3] = '\0';
    return;
  }
  __assert_fail("len < bufLen && totalLen < bufLen && len <= totalLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x99,
                "void fmt_PrintString(char *, size_t, const struct FormatSpec *, const char *)");
}

Assistant:

void fmt_PrintString(char *buf, size_t bufLen, struct FormatSpec const *fmt, char const *value)
{
	if (fmt->sign)
		error("Formatting string with sign flag '%c'\n", fmt->sign);
	if (fmt->prefix)
		error("Formatting string with prefix flag '#'\n");
	if (fmt->padZero)
		error("Formatting string with padding flag '0'\n");
	if (fmt->hasFrac)
		error("Formatting string with fractional width\n");
	if (fmt->type != 's')
		error("Formatting string as type '%c'\n", fmt->type);

	size_t len = strlen(value);
	size_t totalLen = fmt->width > len ? fmt->width : len;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted string value too long\n");
		totalLen = bufLen - 1;
		if (len > totalLen)
			len = totalLen;
	}
	assert(len < bufLen && totalLen < bufLen && len <= totalLen);

	size_t padLen = totalLen - len;

	if (fmt->alignLeft) {
		memcpy(buf, value, len);
		for (size_t i = len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		for (size_t i = 0; i < padLen; i++)
			buf[i] = ' ';
		memcpy(buf + padLen, value, len);
	}

	buf[totalLen] = '\0';
}